

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

PassToken __thiscall spvtools::CreateLoopFusionPass(spvtools *this,size_t max_registers_per_loop)

{
  unique_ptr<spvtools::opt::LoopFusionPass,_std::default_delete<spvtools::opt::LoopFusionPass>_>
  local_28;
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_20;
  size_t local_18;
  size_t max_registers_per_loop_local;
  
  local_18 = max_registers_per_loop;
  max_registers_per_loop_local = (size_t)this;
  MakeUnique<spvtools::opt::LoopFusionPass,unsigned_long&>((spvtools *)&local_28,&local_18);
  MakeUnique<spvtools::Optimizer::PassToken::Impl,std::unique_ptr<spvtools::opt::LoopFusionPass,std::default_delete<spvtools::opt::LoopFusionPass>>>
            ((spvtools *)&local_20,&local_28);
  Optimizer::PassToken::PassToken((PassToken *)this,&local_20);
  std::
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ::~unique_ptr(&local_20);
  std::
  unique_ptr<spvtools::opt::LoopFusionPass,_std::default_delete<spvtools::opt::LoopFusionPass>_>::
  ~unique_ptr(&local_28);
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )this;
}

Assistant:

Optimizer::PassToken CreateLoopFusionPass(size_t max_registers_per_loop) {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::LoopFusionPass>(max_registers_per_loop));
}